

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools.cpp
# Opt level: O1

int Help(int argc,char **argv)

{
  int iVar1;
  AbstractTool *pAVar2;
  allocator local_31;
  string local_30;
  
  if (2 < argc) {
    std::__cxx11::string::string((string *)&local_30,argv[2],&local_31);
    pAVar2 = CreateTool(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    if (pAVar2 != (AbstractTool *)0x0) {
      iVar1 = (*pAVar2->_vptr_AbstractTool[2])(pAVar2);
      (*pAVar2->_vptr_AbstractTool[1])(pAVar2);
      return iVar1;
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"usage: bamtools [--help] COMMAND [ARGS]",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Available bamtools commands:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\tconvert         Converts between BAM and a number of other formats",0x43);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\tcount           Prints number of alignments in BAM file(s)",
             0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\tcoverage        Prints coverage statistics from the input BAM file",0x43);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\tfilter          Filters BAM file(s) by user-specified criteria",0x3f);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\theader          Prints BAM header information",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\tindex           Generates index for BAM file",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\tmerge           Merge multiple BAM files into single file",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\trandom          Select random alignments from existing BAM file(s), intended more as a testing tool."
             ,0x65);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\tresolve         Resolves paired-end reads (marking the IsProperPair flag as needed)"
             ,0x54);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\trevert          Removes duplicate marks and restores original base qualities",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\tsort            Sorts the BAM file according to some criteria"
             ,0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\tsplit           Splits a BAM file on user-specified property, creating a new BAM output file for each value found"
             ,0x72);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\tstats           Prints some basic statistics from input BAM file(s)",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "See \'bamtools help COMMAND\' for more information on a specific command.",0x47);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return 0;
}

Assistant:

int Help(int argc, char* argv[])
{

    // check for 'bamtools help COMMAND' to print tool-specific help message
    if (argc > 2) {

        // determine desired sub-tool
        AbstractTool* tool = CreateTool(argv[2]);

        // if tool known, print its help screen
        if (tool) {
            const int result = tool->Help();
            delete tool;
            return result;
        }
    }

    // print general BamTools help message
    std::cerr << std::endl;
    std::cerr << "usage: bamtools [--help] COMMAND [ARGS]" << std::endl;
    std::cerr << std::endl;
    std::cerr << "Available bamtools commands:" << std::endl;
    std::cerr << "\tconvert         Converts between BAM and a number of other formats"
              << std::endl;
    std::cerr << "\tcount           Prints number of alignments in BAM file(s)" << std::endl;
    std::cerr << "\tcoverage        Prints coverage statistics from the input BAM file"
              << std::endl;
    std::cerr << "\tfilter          Filters BAM file(s) by user-specified criteria" << std::endl;
    std::cerr << "\theader          Prints BAM header information" << std::endl;
    std::cerr << "\tindex           Generates index for BAM file" << std::endl;
    std::cerr << "\tmerge           Merge multiple BAM files into single file" << std::endl;
    std::cerr << "\trandom          Select random alignments from existing BAM file(s), intended "
                 "more as a testing tool."
              << std::endl;
    std::cerr
        << "\tresolve         Resolves paired-end reads (marking the IsProperPair flag as needed)"
        << std::endl;
    std::cerr << "\trevert          Removes duplicate marks and restores original base qualities"
              << std::endl;
    std::cerr << "\tsort            Sorts the BAM file according to some criteria" << std::endl;
    std::cerr << "\tsplit           Splits a BAM file on user-specified property, creating a new "
                 "BAM output file for each value found"
              << std::endl;
    std::cerr << "\tstats           Prints some basic statistics from input BAM file(s)"
              << std::endl;
    std::cerr << std::endl;
    std::cerr << "See 'bamtools help COMMAND' for more information on a specific command."
              << std::endl;
    std::cerr << std::endl;
    return EXIT_SUCCESS;
}